

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_CacheNumberFormat
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  Recycler *recycler;
  Type ppvVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  DynamicObject *state;
  JavascriptString *langtag;
  JavascriptString *this;
  void **resource;
  FinalizableICUObject<void_**,_&unum_close_70> *pFVar9;
  LPCSTR pCVar10;
  uint in_stack_00000010;
  Var in_stack_00000020;
  undefined8 uStack_f0;
  char local_e8 [8];
  char localeID [157];
  int local_34 [2];
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar5 = callInfo._0_4_;
  if (in_stack_00000010 != uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x5e7,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00a2c4d7;
    *puVar8 = 0;
  }
  if ((uVar5 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x5e7,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00a2c4d7;
    *puVar8 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar5 & 0xffffff) == 2) {
    bVar4 = DynamicObject::IsBaseDynamicObject(in_stack_00000020);
    if (!bVar4) goto LAB_00a2c0f7;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x5e7,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar4) goto LAB_00a2c4d7;
      *puVar8 = 0;
    }
LAB_00a2c0f7:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x5e8,
                                "((args.Info.Count == 2 && DynamicObject::IsBaseDynamicObject(args.Values[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar4) goto LAB_00a2c4d7;
    *puVar8 = 0;
  }
  state = UnsafeVarTo<Js::DynamicObject>(in_stack_00000020);
  uVar5 = AssertIntegerProperty(state,(PropertyIds)0x243);
  if (2 < uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x19d,"(p >= 0 && ret < T::Max)","Invalid value for enum property")
    ;
    if (!bVar4) goto LAB_00a2c4d7;
    *puVar8 = 0;
  }
  local_34[0] = 0;
  langtag = AssertStringProperty(state,(PropertyIds)0x20d);
  this = (JavascriptString *)0x0;
  memset((char (*) [157])local_e8,0,0x9d);
  LangtagToLocaleID<157ul>(langtag,(char (*) [157])local_e8);
  if (uVar5 == 0) {
    uStack_f0 = 1;
  }
  else {
    if (uVar5 == 2) {
      uVar5 = AssertIntegerProperty(state,(PropertyIds)0x242);
      if (2 < uVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x19d,"(p >= 0 && ret < T::Max)",
                                    "Invalid value for enum property");
        if (!bVar4) goto LAB_00a2c4d7;
        *puVar8 = 0;
      }
      if (uVar5 == 0) {
        uStack_f0 = 2;
LAB_00a2c2a0:
        bVar4 = false;
      }
      else {
        if (uVar5 == 2) {
          uStack_f0 = 0xb;
          goto LAB_00a2c2a0;
        }
        if (uVar5 == 1) {
          uStack_f0 = 10;
          goto LAB_00a2c2a0;
        }
        uStack_f0 = 0;
        bVar4 = true;
      }
      this = AssertStringProperty(state,(PropertyIds)0x240);
      if (!bVar4) goto LAB_00a2c317;
    }
    else if (uVar5 == 1) {
      uStack_f0 = 3;
      this = (JavascriptString *)0x0;
      goto LAB_00a2c317;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x615,"(unumStyle != UNUM_IGNORE)","unumStyle != UNUM_IGNORE");
    if (!bVar4) goto LAB_00a2c4d7;
    *puVar8 = 0;
    uStack_f0 = 0;
  }
LAB_00a2c317:
  recycler = pSVar1->recycler;
  resource = (void **)unum_open_70(uStack_f0,0,0,local_e8,0,local_34);
  pFVar9 = FinalizableICUObject<void_**,_&unum_close_70>::New(recycler,resource);
  if (local_34[0] != 7) {
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x618,"(false)",pCVar10);
      if (!bVar4) goto LAB_00a2c4d7;
      *puVar8 = 0;
    }
    bVar4 = AssertBooleanProperty(state,(PropertyIds)0x24a);
    unum_setAttribute_70(pFVar9->resource,1,bVar4);
    unum_setAttribute_70(pFVar9->resource,0xb,6);
    SetUNumberFormatDigitOptions(pFVar9->resource,state);
    if (this != (JavascriptString *)0x0) {
      ppvVar2 = pFVar9->resource;
      iVar6 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x65])(this);
      cVar7 = JavascriptString::GetLength(this);
      unum_setTextAttribute_70(ppvVar2,5,iVar6,cVar7,local_34);
      if (local_34[0] == 7) goto LAB_00a2c4d9;
      if (0 < local_34[0] || local_34[0] == -0x7c) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x624,"(false)",pCVar10);
        if (!bVar4) {
LAB_00a2c4d7:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
    }
    (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(state,10,pFVar9,0,0);
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  }
LAB_00a2c4d9:
  Throw::OutOfMemory();
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_CacheNumberFormat(RecyclableObject * function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 2 && DynamicObject::IsBaseDynamicObject(args.Values[1]));

#if defined(INTL_ICU)
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args.Values[1]);

        // always AssertOrFailFast that the properties we need are there, because if they aren't, Intl.js isn't functioning correctly
        NumberFormatStyle style = AssertEnumProperty<NumberFormatStyle>(state, PropertyIds::formatterToUse);

        UNumberFormatStyle unumStyle = UNUM_IGNORE;
        UErrorCode status = U_ZERO_ERROR;
        JavascriptString *currency = nullptr;

        JavascriptString *langtag = AssertStringProperty(state, PropertyIds::locale);
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        LangtagToLocaleID(langtag, localeID);

        if (style == NumberFormatStyle::Decimal)
        {
            unumStyle = UNUM_DECIMAL;
        }
        else if (style == NumberFormatStyle::Percent)
        {
            unumStyle = UNUM_PERCENT;
        }
        else if (style == NumberFormatStyle::Currency)
        {
            NumberFormatCurrencyDisplay nfcd = AssertEnumProperty<NumberFormatCurrencyDisplay>(state, PropertyIds::currencyDisplayToUse);

            // TODO(jahorto): Investigate making our enum values equal to the corresponding UNumberFormatStyle values
            if (nfcd == NumberFormatCurrencyDisplay::Symbol)
            {
                unumStyle = UNUM_CURRENCY;
            }
            else if (nfcd == NumberFormatCurrencyDisplay::Code)
            {
                unumStyle = UNUM_CURRENCY_ISO;
            }
            else if (nfcd == NumberFormatCurrencyDisplay::Name)
            {
                unumStyle = UNUM_CURRENCY_PLURAL;
            }

            currency = AssertStringProperty(state, PropertyIds::currency);
        }

        AssertOrFailFast(unumStyle != UNUM_IGNORE);

        auto fmt = FinalizableUNumberFormat::New(scriptContext->GetRecycler(), unum_open(unumStyle, nullptr, 0, localeID, nullptr, &status));
        ICU_ASSERT(status, true);

        bool groupingUsed = AssertBooleanProperty(state, PropertyIds::useGrouping);
        unum_setAttribute(*fmt, UNUM_GROUPING_USED, groupingUsed);

        unum_setAttribute(*fmt, UNUM_ROUNDING_MODE, UNUM_ROUND_HALFUP);

        SetUNumberFormatDigitOptions(*fmt, state);

        if (currency != nullptr)
        {
            unum_setTextAttribute(*fmt, UNUM_CURRENCY_CODE, reinterpret_cast<const UChar *>(currency->GetSz()), currency->GetLength(), &status);
            ICU_ASSERT(status, true);
        }

        state->SetInternalProperty(
            InternalPropertyIds::CachedUNumberFormat,
            fmt,
            PropertyOperationFlags::PropertyOperation_None,
            nullptr
        );

        return scriptContext->GetLibrary()->GetUndefined();
#else
        HRESULT hr = S_OK;
        JavascriptString *localeJSstr = nullptr;
        DynamicObject *options = VarTo<DynamicObject>(args.Values[1]);
        DelayLoadWindowsGlobalization* wgl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
        WindowsGlobalizationAdapter* wga = GetWindowsGlobalizationAdapter(scriptContext);
        Var propertyValue;

        // Verify locale is present
        // REVIEW (doilij): Fix comparison of the unsigned value <= 0
        if (!GetTypedPropertyBuiltInFrom(options, __locale, JavascriptString) || (localeJSstr = VarTo<JavascriptString>(propertyValue))->GetLength() <= 0)
        {
            // REVIEW (doilij): Should we throw? Or otherwise, from Intl.js, should detect something didn't work right here...
            return scriptContext->GetLibrary()->GetUndefined();
        }

        //First we have to determine which formatter(number, percent, or currency) we will be using.
        //Note some options might not be present.
        AutoCOMPtr<NumberFormatting::INumberFormatter> numberFormatter(nullptr);
        PCWSTR locale = localeJSstr->GetSz();

        uint16 formatterToUseVal = 0; // 0 (default) is number, 1 is percent, 2 is currency
        if (GetTypedPropertyBuiltInFrom(options, __formatterToUse, TaggedInt) && (formatterToUseVal = TaggedInt::ToUInt16(propertyValue)) == 1)
        {
            //Use the percent formatter
            IfFailThrowHr(wga->CreatePercentFormatter(scriptContext, &locale, 1, &numberFormatter));
        }
        else if (formatterToUseVal == 2)
        {
            //Use the currency formatter
            AutoCOMPtr<NumberFormatting::ICurrencyFormatter> currencyFormatter(nullptr);
            if (!GetTypedPropertyBuiltInFrom(options, __currency, JavascriptString))
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            //API call retrieves a currency formatter, have to query its interface for numberFormatter
            IfFailThrowHr(GetWindowsGlobalizationAdapter(scriptContext)->CreateCurrencyFormatter(scriptContext, &locale, 1, VarTo<JavascriptString>(propertyValue)->GetSz(), &currencyFormatter));

            if (GetTypedPropertyBuiltInFrom(options, __currencyDisplayToUse, TaggedInt)) // 0 is for symbol, 1 is for code, 2 is for name.
                                                                                         //Currently name isn't supported; so it will default to code in that case.
            {
                AutoCOMPtr<NumberFormatting::ICurrencyFormatter2> currencyFormatter2(nullptr);
                IfFailThrowHr(currencyFormatter->QueryInterface(__uuidof(NumberFormatting::ICurrencyFormatter2), reinterpret_cast<void**>(&currencyFormatter2)));

                if (TaggedInt::ToUInt16(propertyValue) == 0)
                {
                    IfFailThrowHr(currencyFormatter2->put_Mode(NumberFormatting::CurrencyFormatterMode::CurrencyFormatterMode_UseSymbol));
                }
                else
                {
                    IfFailThrowHr(currencyFormatter2->put_Mode(NumberFormatting::CurrencyFormatterMode::CurrencyFormatterMode_UseCurrencyCode));
                }
            }

            IfFailThrowHr(currencyFormatter->QueryInterface(__uuidof(NumberFormatting::INumberFormatter), reinterpret_cast<void**>(&numberFormatter)));
        }
        else
        {
            //Use the number formatter (default)
            IfFailThrowHr(wga->CreateNumberFormatter(scriptContext, &locale, 1, &numberFormatter));
        }
        Assert(numberFormatter);

        AutoCOMPtr<NumberFormatting::ISignedZeroOption> signedZeroOption(nullptr);
        IfFailThrowHr(numberFormatter->QueryInterface(__uuidof(NumberFormatting::ISignedZeroOption), reinterpret_cast<void**>(&signedZeroOption)));
        IfFailThrowHr(signedZeroOption->put_IsZeroSigned(true));

        //Configure non-digit related options
        AutoCOMPtr<NumberFormatting::INumberFormatterOptions> numberFormatterOptions(nullptr);
        IfFailThrowHr(numberFormatter->QueryInterface(__uuidof(NumberFormatting::INumberFormatterOptions), reinterpret_cast<void**>(&numberFormatterOptions)));
        Assert(numberFormatterOptions);

        if (GetTypedPropertyBuiltInFrom(options, __useGrouping, JavascriptBoolean))
        {
            IfFailThrowHr(numberFormatterOptions->put_IsGrouped((boolean)(VarTo<JavascriptBoolean>(propertyValue)->GetValue())));
        }

        //Get the numeral system and add it to the object since it will be located in the locale
        AutoHSTRING hNumeralSystem;
        AutoHSTRING hResolvedLanguage;
        uint32 length;
        IfFailThrowHr(wga->GetNumeralSystem(numberFormatterOptions, &hNumeralSystem));
        SetHSTRINGPropertyBuiltInOn(options, __numberingSystem, *hNumeralSystem);

        IfFailThrowHr(wga->GetResolvedLanguage(numberFormatterOptions, &hResolvedLanguage));
        SetHSTRINGPropertyBuiltInOn(options, __locale, *hResolvedLanguage);

        AutoCOMPtr<NumberFormatting::INumberRounderOption> rounderOptions(nullptr);
        IfFailThrowHr(numberFormatter->QueryInterface(__uuidof(NumberFormatting::INumberRounderOption), reinterpret_cast<void**>(&rounderOptions)));
        Assert(rounderOptions);

        if (HasPropertyBuiltInOn(options, __minimumSignificantDigits) || HasPropertyBuiltInOn(options, __maximumSignificantDigits))
        {
            uint16 minSignificantDigits = 1, maxSignificantDigits = 21;
            //Do significant digit rounding
            if (GetTypedPropertyBuiltInFrom(options, __minimumSignificantDigits, TaggedInt))
            {
                minSignificantDigits = max<uint16>(min<uint16>(TaggedInt::ToUInt16(propertyValue), 21), 1);
            }
            if (GetTypedPropertyBuiltInFrom(options, __maximumSignificantDigits, TaggedInt))
            {
                maxSignificantDigits = max<uint16>(min<uint16>(TaggedInt::ToUInt16(propertyValue), 21), minSignificantDigits);
            }
            prepareWithSignificantDigits(scriptContext, rounderOptions, numberFormatter, numberFormatterOptions, minSignificantDigits, maxSignificantDigits);
        }
        else
        {
            uint16 minFractionDigits = 0, maxFractionDigits = 3, minIntegerDigits = 1;
            //Do fraction/integer digit rounding
            if (GetTypedPropertyBuiltInFrom(options, __minimumIntegerDigits, TaggedInt))
            {
                minIntegerDigits = max<uint16>(min<uint16>(TaggedInt::ToUInt16(propertyValue), 21), 1);
            }
            if (GetTypedPropertyBuiltInFrom(options, __minimumFractionDigits, TaggedInt))
            {
                minFractionDigits = min<uint16>(TaggedInt::ToUInt16(propertyValue), 20);//ToUInt16 will get rid of negatives by making them high
            }
            if (GetTypedPropertyBuiltInFrom(options, __maximumFractionDigits, TaggedInt))
            {
                maxFractionDigits = max(min<uint16>(TaggedInt::ToUInt16(propertyValue), 20), minFractionDigits);//ToUInt16 will get rid of negatives by making them high
            }
            prepareWithFractionIntegerDigits(scriptContext, rounderOptions, numberFormatterOptions, minFractionDigits, maxFractionDigits + (formatterToUseVal == 1 ? 2 : 0), minIntegerDigits);//extend max fractions for percent
        }

        //Set the object as a cache
        numberFormatter->AddRef();
        options->SetInternalProperty(Js::InternalPropertyIds::HiddenObject, AutoCOMJSObject::New(scriptContext->GetRecycler(), numberFormatter), Js::PropertyOperationFlags::PropertyOperation_None, NULL);

        return scriptContext->GetLibrary()->GetUndefined();
#endif
    }